

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::
addEvent<std::unique_ptr<int,std::default_delete<int>>const&,std::unique_ptr<int,std::default_delete<int>>const&,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>const&,int>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          unique_ptr<int,_std::default_delete<int>_> *args,
          unique_ptr<int,_std::default_delete<int>_> *args_1,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *args_2,
          int *args_3)

{
  ulong minQueueCapacity;
  QueueWriter *this_00;
  char **ppcVar1;
  int *piVar2;
  int *piVar3;
  undefined4 uVar4;
  Queue *pQVar5;
  void *result;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  long lVar10;
  undefined1 auVar11 [16];
  long lVar12;
  long local_68 [2];
  undefined1 local_58 [16];
  long local_48;
  undefined8 local_40;
  
  local_68[0] = 8;
  local_68[1] = 8;
  piVar2 = (args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  piVar3 = (args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  auVar11._0_4_ = -(uint)((int)piVar3 == 0);
  auVar11._4_4_ = -(uint)((int)((ulong)piVar3 >> 0x20) == 0);
  auVar11._8_4_ = -(uint)((int)piVar2 == 0);
  auVar11._12_4_ = -(uint)((int)((ulong)piVar2 >> 0x20) == 0);
  auVar9._4_4_ = auVar11._0_4_;
  auVar9._0_4_ = auVar11._4_4_;
  auVar9._8_4_ = auVar11._12_4_;
  auVar9._12_4_ = auVar11._8_4_;
  local_58 = auVar9 & auVar11 & _DAT_001bedb0 | ~(auVar9 & auVar11) & _DAT_001beda0;
  sVar6 = mserialize::detail::
          BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
          ::sizeof_elems(args_2);
  local_48 = sVar6 + 4;
  local_40 = 4;
  lVar7 = 0;
  lVar10 = 0;
  lVar12 = 0;
  do {
    lVar10 = lVar10 + local_68[lVar7];
    lVar12 = lVar12 + *(long *)(local_58 + lVar7 * 8 + -8);
    lVar7 = lVar7 + 2;
  } while (lVar7 != 6);
  minQueueCapacity = lVar12 + lVar10 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) &&
       (sVar6 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar6 < minQueueCapacity)) &&
      (replaceChannel(this,minQueueCapacity),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
     (sVar6 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar6 < minQueueCapacity)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)(lVar12 + lVar10);
  pcVar8 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar8 + 4;
  *(uint64_t *)(pcVar8 + 4) = eventSourceId;
  pcVar8 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar8 + 8;
  *(uint64_t *)(pcVar8 + 8) = clock;
  pcVar8 = (this->_qw)._writePos + 8;
  (this->_qw)._writePos = pcVar8;
  if ((args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl == (int *)0x0) {
    *pcVar8 = '\0';
    lVar7 = 1;
  }
  else {
    *pcVar8 = '\x01';
    pcVar8 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar8 + 1;
    *(int *)(pcVar8 + 1) =
         *(args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl;
    lVar7 = 4;
  }
  pcVar8 = (this->_qw)._writePos + lVar7;
  (this->_qw)._writePos = pcVar8;
  if ((args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl == (int *)0x0) {
    *pcVar8 = '\0';
    lVar7 = 1;
  }
  else {
    *pcVar8 = '\x01';
    pcVar8 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar8 + 1;
    *(int *)(pcVar8 + 1) =
         *(args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl;
    lVar7 = 4;
  }
  pcVar8 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar8 + lVar7;
  uVar4 = (undefined4)(args_2->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  *(undefined4 *)(pcVar8 + lVar7) = uVar4;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 4;
  mserialize::detail::
  BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
  ::serialize_elems<binlog::detail::QueueWriter>(args_2,uVar4,this_00);
  *(int *)(this->_qw)._writePos = *args_3;
  pQVar5 = (this->_qw)._queue;
  pcVar8 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar8;
  (pQVar5->writeIndex).super___atomic_base<unsigned_long>._M_i = (long)pcVar8 - (long)pQVar5->buffer
  ;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}